

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

bool __thiscall
re2::DFA::InlinedSearchLoop
          (DFA *this,SearchParams *params,bool have_firstbyte,bool want_earliest_match,
          bool run_forward)

{
  size_t sVar1;
  byte bVar2;
  char *pcVar3;
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar4;
  iterator __position;
  bool bVar5;
  uint32 *puVar6;
  State *pSVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  void *pvVar12;
  State *pSVar13;
  State *pSVar14;
  undefined7 in_register_00000009;
  byte *pbVar15;
  undefined7 in_register_00000011;
  Inst *pIVar16;
  size_t sVar17;
  ulong uVar18;
  undefined3 in_register_00000081;
  long lVar19;
  byte *__s;
  StateSaver save_start;
  StateSaver save_s;
  uint local_23c;
  ulong local_238;
  byte *local_230;
  StateSaver local_228;
  byte *local_200;
  State *local_1f8;
  uint local_1f0;
  undefined4 local_1ec;
  StateSaver local_1e8;
  ulong local_1c0;
  Prog *local_1b8;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_1b0 [2];
  anon_union_4_5_a3ff96c3_for_Inst_2 local_1a8 [94];
  
  local_1ec = (undefined4)CONCAT71(in_register_00000011,have_firstbyte);
  pbVar11 = (byte *)(params->text).ptr_;
  local_1f8 = params->start;
  __s = pbVar11 + (params->text).length_;
  if (CONCAT31(in_register_00000081,run_forward) == 0) {
    __s = pbVar11;
    pbVar11 = pbVar11 + (params->text).length_;
  }
  local_1f0 = (uint)CONCAT71(in_register_00000009,want_earliest_match);
  if ((local_1f8->flag_ >> 0xc & local_1f0) == 0) {
    local_1b8 = this->prog_;
    uVar9 = local_1f8->flag_ & 0x1000;
    local_23c = uVar9 >> 0xc;
    local_230 = (byte *)0x0;
    local_200 = (byte *)0x0;
    if (uVar9 != 0) {
      local_200 = pbVar11;
    }
    local_238 = -(ulong)run_forward | 1;
    pSVar14 = local_1f8;
    local_1c0 = local_238;
    do {
      pbVar15 = pbVar11;
      if ((long)pbVar11 - (long)__s == 0) goto LAB_001312f7;
      if (((char)local_1ec != '\0') && (pSVar14 == local_1f8)) {
        pbVar15 = __s;
        if (run_forward) {
          pbVar11 = (byte *)memchr(pbVar11,params->firstbyte,(long)__s - (long)pbVar11);
          if (pbVar11 == (byte *)0x0) {
LAB_001312f7:
            pcVar3 = (params->text).ptr_;
            if (run_forward) {
              pbVar11 = (byte *)(pcVar3 + (params->text).length_);
              if (pbVar11 == (byte *)((params->context).ptr_ + (params->context).length_))
              goto LAB_00131327;
LAB_00131322:
              uVar9 = (uint)*pbVar11;
            }
            else {
              if (pcVar3 != (params->context).ptr_) {
                pbVar11 = (byte *)(pcVar3 + -1);
                goto LAB_00131322;
              }
LAB_00131327:
              uVar9 = 0x100;
            }
            if (uVar9 == 0x100) {
              uVar10 = this->prog_->bytemap_range_;
            }
            else {
              uVar10 = (uint)this->prog_->bytemap_[uVar9];
            }
            pSVar13 = (State *)(&pSVar14[1].inst_)[(int)uVar10];
            if ((pSVar13 == (State *)0x0) &&
               (pSVar13 = RunStateOnByteUnlocked(this,pSVar14,uVar9), pSVar13 == (State *)0x0)) {
              if (pSVar14 < (State *)0x3) {
                local_228.inst_ = (int *)0x0;
                local_228.ninst_ = 0;
                local_228.flag_ = 0;
                local_228.is_special_ = true;
                local_228.dfa_ = this;
                local_228.special_ = pSVar14;
              }
              else {
                local_228.is_special_ = false;
                local_228.special_ = (State *)0x0;
                local_228.ninst_ = pSVar14->ninst_;
                local_228.flag_ = pSVar14->flag_;
                sVar1 = (long)pSVar14->ninst_ * 4;
                uVar18 = 0xffffffffffffffff;
                if (-1 < (long)pSVar14->ninst_) {
                  uVar18 = sVar1;
                }
                local_228.dfa_ = this;
                local_228.inst_ = (int *)operator_new__(uVar18);
                memmove(local_228.inst_,pSVar14->inst_,sVar1);
              }
              ResetCache(this,params->cache_lock);
              pSVar14 = StateSaver::Restore(&local_228);
              if (pSVar14 == (State *)0x0) {
LAB_0013146d:
                params->failed = true;
                bVar5 = false;
                pSVar13 = (State *)0x0;
                local_238._0_1_ = 0;
              }
              else {
                pSVar13 = RunStateOnByteUnlocked(this,pSVar14,uVar9);
                if (pSVar13 == (State *)0x0) {
                  LogMessage::LogMessage
                            ((LogMessage *)&local_1b0[0].field_3,
                             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc"
                             ,0x5ce,3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8[0].field_3,
                             "RunStateOnByteUnlocked failed after Reset",0x29);
                  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0[0].field_3);
                  goto LAB_0013146d;
                }
                bVar5 = true;
              }
              if ((local_228.is_special_ == false) && (local_228.inst_ != (int *)0x0)) {
                operator_delete__(local_228.inst_);
              }
              if (!bVar5) break;
            }
            if (pSVar13 != (State *)0x2) {
              pbVar11 = local_200;
              if (((State *)0x2 < pSVar13) && ((pSVar13->flag_ & 0x1000) != 0)) {
                this_00 = params->matches;
                local_23c._0_1_ = 1;
                pbVar11 = pbVar15;
                if ((this_00 != (vector<int,_std::allocator<int>_> *)0x0) &&
                   (this->kind_ == kManyMatch)) {
                  piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish != piVar4) {
                    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = piVar4;
                  }
                  if (0 < pSVar13->ninst_) {
                    lVar19 = 0;
                    do {
                      pIVar16 = this->prog_->inst_ + pSVar13->inst_[lVar19];
                      do {
                        if ((pIVar16->out_opcode_ & 7) == 5) {
                          if ((pIVar16->out_opcode_ & 7) != 5) {
                            __assert_fail("(opcode()) == (kInstMatch)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                                          ,0x72,"int re2::Prog::Inst::match_id()");
                          }
                          local_1b0[0] = pIVar16->field_1;
                          __position._M_current =
                               (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                      (this_00,__position,&local_1b0[0].cap_);
                          }
                          else {
                            *__position._M_current = (int)local_1b0[0];
                            (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish = __position._M_current + 1;
                          }
                        }
                        puVar6 = &pIVar16->out_opcode_;
                        pIVar16 = pIVar16 + 1;
                      } while ((*puVar6 & 8) == 0);
                      lVar19 = lVar19 + 1;
                    } while (lVar19 < pSVar13->ninst_);
                  }
                }
              }
              params->ep = (char *)pbVar11;
              local_238._0_1_ = (byte)local_23c;
              break;
            }
            params->ep = (char *)__s;
            goto LAB_00130ee4;
          }
        }
        else {
          pvVar12 = memrchr(__s,params->firstbyte,(long)pbVar11 - (long)__s);
          if (pvVar12 == (void *)0x0) goto LAB_001312f7;
          pbVar11 = (byte *)((long)pvVar12 + 1);
        }
      }
      pbVar15 = pbVar11 + -1;
      pbVar8 = pbVar15;
      if (run_forward) {
        pbVar15 = pbVar11;
        pbVar8 = pbVar11 + 1;
      }
      pbVar11 = pbVar8;
      bVar2 = *pbVar15;
      pSVar13 = (State *)(&pSVar14[1].inst_)[local_1b8->bytemap_[bVar2]];
      if (pSVar13 == (State *)0x0) {
        pSVar13 = RunStateOnByteUnlocked(this,pSVar14,(uint)bVar2);
        pSVar7 = local_1f8;
        if (pSVar13 != (State *)0x0) goto LAB_00130ff8;
        if (((FLAGS_re2_dfa_bail_when_slow == '\x01') && (local_230 != (byte *)0x0)) &&
           ((ulong)((long)pbVar11 - (long)local_230) <
            (this->state_cache_)._M_h._M_element_count * 10)) {
          params->failed = true;
          bVar5 = false;
          local_238 = 0;
          pSVar13 = pSVar14;
        }
        else {
          if (local_1f8 < (State *)0x3) {
            local_228.inst_ = (int *)0x0;
            local_228.ninst_ = 0;
            local_228.flag_ = 0;
            local_228.is_special_ = true;
            local_228.special_ = local_1f8;
            local_228.dfa_ = this;
          }
          else {
            local_228.is_special_ = false;
            local_228.special_ = (State *)0x0;
            local_228.ninst_ = local_1f8->ninst_;
            local_228.flag_ = local_1f8->flag_;
            sVar1 = (long)local_1f8->ninst_ * 4;
            sVar17 = sVar1;
            if ((long)local_1f8->ninst_ < 0) {
              sVar17 = 0xffffffffffffffff;
            }
            local_228.dfa_ = this;
            local_228.inst_ = (int *)operator_new__(sVar17);
            memmove(local_228.inst_,pSVar7->inst_,sVar1);
          }
          local_1e8.dfa_ = this;
          if (pSVar14 < (State *)0x3) {
            local_1e8.inst_ = (int *)0x0;
            local_1e8.ninst_ = 0;
            local_1e8.flag_ = 0;
            local_1e8.is_special_ = true;
            local_1e8.special_ = pSVar14;
          }
          else {
            local_1e8.is_special_ = false;
            local_1e8.special_ = (State *)0x0;
            local_1e8.ninst_ = pSVar14->ninst_;
            local_1e8.flag_ = pSVar14->flag_;
            sVar1 = (long)pSVar14->ninst_ * 4;
            sVar17 = sVar1;
            if ((long)pSVar14->ninst_ < 0) {
              sVar17 = 0xffffffffffffffff;
            }
            local_1e8.inst_ = (int *)operator_new__(sVar17);
            memmove(local_1e8.inst_,pSVar14->inst_,sVar1);
          }
          ResetCache(this,params->cache_lock);
          local_1f8 = StateSaver::Restore(&local_228);
          if (local_1f8 == (State *)0x0) {
LAB_00131286:
            params->failed = true;
            bVar5 = false;
            pSVar13 = (State *)0x0;
            local_238 = 0;
          }
          else {
            pSVar14 = StateSaver::Restore(&local_1e8);
            if (pSVar14 == (State *)0x0) {
              pSVar14 = (State *)0x0;
              goto LAB_00131286;
            }
            pSVar13 = RunStateOnByteUnlocked(this,pSVar14,(uint)bVar2);
            if (pSVar13 == (State *)0x0) {
              LogMessage::LogMessage
                        ((LogMessage *)&local_1b0[0].field_3,
                         "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc"
                         ,0x58e,3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8[0].field_3,
                         "RunStateOnByteUnlocked failed after ResetCache",0x2e);
              LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0[0].field_3);
              goto LAB_00131286;
            }
            bVar5 = true;
          }
          if ((local_1e8.is_special_ == false) && (local_1e8.inst_ != (int *)0x0)) {
            operator_delete__(local_1e8.inst_);
          }
          if ((local_228.is_special_ == false) && (local_228.inst_ != (int *)0x0)) {
            operator_delete__(local_228.inst_);
          }
          local_230 = pbVar11;
          if (bVar5) goto LAB_00130ff8;
          bVar5 = false;
          pSVar13 = pSVar14;
        }
      }
      else {
LAB_00130ff8:
        if (pSVar13 < (State *)0x3) {
          if (pSVar13 == (State *)0x1) {
            params->ep = (char *)local_200;
            local_238 = (ulong)local_23c;
LAB_00131080:
            bVar5 = false;
            pSVar13 = pSVar14;
          }
          else {
            params->ep = (char *)__s;
            local_238 = 1;
            bVar5 = false;
            pSVar13 = pSVar14;
          }
        }
        else {
          bVar5 = true;
          if ((pSVar13->flag_ & 0x1000) != 0) {
            local_200 = pbVar11 + local_1c0;
            local_23c = 1;
            if ((char)local_1f0 != '\0') {
              params->ep = (char *)local_200;
              local_23c = 1;
              local_238 = 1;
              pSVar14 = pSVar13;
              goto LAB_00131080;
            }
            bVar5 = true;
          }
        }
      }
      pSVar14 = pSVar13;
    } while (bVar5);
  }
  else {
    params->ep = (char *)pbVar11;
LAB_00130ee4:
    local_238._0_1_ = 1;
  }
  return (bool)((byte)local_238 & 1);
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params,
                                   bool have_firstbyte,
                                   bool want_earliest_match,
                                   bool run_forward) {
  State* start = params->start;
  const uint8* bp = BytePtr(params->text.begin());  // start of text
  const uint8* p = bp;                              // text scanning point
  const uint8* ep = BytePtr(params->text.end());    // end of text
  const uint8* resetp = NULL;                       // p at last cache reset
  if (!run_forward)
    swap(p, ep);

  const uint8* bytemap = prog_->bytemap();
  const uint8* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;
  State* s = start;

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {
    if (DebugDFA)
      fprintf(stderr, "@%d: %s\n", static_cast<int>(p - bp),
              DumpState(s).c_str());
    if (have_firstbyte && s == start) {
      // In start state, only way out is to find firstbyte,
      // so use optimized assembly in memchr to skip ahead.
      // If firstbyte isn't found, we can skip to the end
      // of the string.
      if (run_forward) {
        if ((p = BytePtr(memchr(p, params->firstbyte, ep - p))) == NULL) {
          p = ep;
          break;
        }
      } else {
        if ((p = BytePtr(memrchr(ep, params->firstbyte, p - ep))) == NULL) {
          p = ep;
          break;
        }
        p++;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.
        if (FLAGS_re2_dfa_bail_when_slow && resetp != NULL &&
            static_cast<unsigned long>(p - resetp) < 10*state_cache_.size()) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }
    s = ns;

    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (DebugDFA)
        fprintf(stderr, "match @%d! [%s]\n",
                static_cast<int>(lastmatch - bp),
                DumpState(s).c_str());

      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)
  int lastbyte;
  if (run_forward) {
    if (params->text.end() == params->context.end())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.end()[0] & 0xFF;
  } else {
    if (params->text.begin() == params->context.begin())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.begin()[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  s = ns;
  if (DebugDFA)
    fprintf(stderr, "@_: %s\n", DumpState(s).c_str());
  if (s == FullMatchState) {
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }
  if (s > SpecialStateMax && s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches && kind_ == Prog::kManyMatch) {
      vector<int>* v = params->matches;
      v->clear();
      for (int i = 0; i < s->ninst_; i++) {
        Prog::Inst* ip = prog_->inst(s->inst_[i]);
        for (;;) {
          if (ip->opcode() == kInstMatch)
            v->push_back(ip->match_id());
          if (ip->last())
            break;
          ip++;
        }
      }
    }
    if (DebugDFA)
      fprintf(stderr, "match @%d! [%s]\n", static_cast<int>(lastmatch - bp),
              DumpState(s).c_str());
  }
  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}